

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O2

cio_error cio_http_server_init
                    (cio_http_server *server,cio_eventloop *loop,
                    cio_http_server_configuration *config)

{
  cio_alloc_client_t p_Var1;
  cio_free_client_t p_Var2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  cio_address_family family;
  cio_error cVar8;
  long lVar9;
  cio_http_server_configuration *pcVar10;
  cio_http_server *pcVar11;
  
  cVar8 = CIO_INVALID_ARGUMENT;
  if (((((loop != (cio_eventloop *)0x0) && (server != (cio_http_server *)0x0)) &&
       (config != (cio_http_server_configuration *)0x0)) &&
      ((p_Var1 = config->alloc_client, p_Var1 != (cio_alloc_client_t)0x0 &&
       (p_Var2 = config->free_client, p_Var2 != (cio_free_client_t)0x0)))) &&
     ((uVar3 = config->read_header_timeout_ns, uVar3 != 0 &&
      ((uVar4 = config->read_body_timeout_ns, uVar4 != 0 &&
       (uVar5 = config->response_timeout_ns, uVar5 != 0)))))) {
    server->loop = loop;
    server->alloc_client = p_Var1;
    server->free_client = p_Var2;
    server->first_location = (cio_http_location *)0x0;
    server->num_handlers = 0;
    server->on_error = config->on_error;
    server->read_header_timeout_ns = uVar3;
    server->read_body_timeout_ns = uVar4;
    server->response_timeout_ns = uVar5;
    server->close_hook = (cio_http_server_close_hook_t)0x0;
    pcVar10 = config;
    pcVar11 = server;
    for (lVar9 = 0x74; lVar9 != 0; lVar9 = lVar9 + -1) {
      *(char *)&(pcVar11->endpoint).impl.len = (char)(pcVar10->endpoint).impl.len;
      pcVar10 = (cio_http_server_configuration *)((long)&(pcVar10->endpoint).impl.len + 1);
      pcVar11 = (cio_http_server *)((long)&(pcVar11->endpoint).impl.len + 1);
    }
    auVar6._8_8_ = 0;
    auVar6._0_8_ = config->read_header_timeout_ns;
    uVar7 = snprintf(server->keepalive_header,0x21,"Keep-Alive: timeout=%u\r\n",
                     (ulong)SUB164(auVar6 / ZEXT816(1000000000),0));
    if (uVar7 < 0x20) {
      family = cio_socket_address_get_family(&server->endpoint);
      cVar8 = cio_server_socket_init
                        (&server->server_socket,server->loop,5,family,server->alloc_client,
                         server->free_client,config->close_timeout_ns,server_socket_closed);
      if ((cVar8 == CIO_SUCCESS) && (cVar8 = CIO_SUCCESS, config->use_tcp_fastopen == true)) {
        cVar8 = cio_server_socket_set_tcp_fast_open(&server->server_socket,true);
        return cVar8;
      }
    }
    else {
      cVar8 = CIO_NO_BUFFER_SPACE;
    }
  }
  return cVar8;
}

Assistant:

enum cio_error cio_http_server_init(struct cio_http_server *server,
                                    struct cio_eventloop *loop,
                                    const struct cio_http_server_configuration *config)
{
	if (cio_unlikely((server == NULL) || (config == NULL) ||
	                 (loop == NULL) || (config->alloc_client == NULL) || (config->free_client == NULL) ||
	                 (config->read_header_timeout_ns == 0) || (config->read_body_timeout_ns == 0) || (config->response_timeout_ns == 0))) {
		return CIO_INVALID_ARGUMENT;
	}

	server->loop = loop;
	server->alloc_client = config->alloc_client;
	server->free_client = config->free_client;
	server->first_location = NULL;
	server->num_handlers = 0;
	server->on_error = config->on_error;
	server->read_header_timeout_ns = config->read_header_timeout_ns;
	server->read_body_timeout_ns = config->read_body_timeout_ns;
	server->response_timeout_ns = config->response_timeout_ns;
	server->close_hook = NULL;
	memcpy(&server->endpoint, &config->endpoint, sizeof(config->endpoint));

	uint32_t keep_alive = (uint32_t)(config->read_header_timeout_ns / NANO_SECONDS_IN_SECONDS);
	int ret = snprintf(server->keepalive_header, sizeof(server->keepalive_header), "Keep-Alive: timeout=%" PRIu32 "\r\n", keep_alive);
	if (cio_unlikely((ret < 0) || ((size_t)ret >= sizeof(server->keepalive_header) - 1))) {
		return CIO_NO_BUFFER_SPACE;
	}

	enum cio_address_family family = cio_socket_address_get_family(&server->endpoint);
	enum cio_error err = cio_server_socket_init(&server->server_socket, server->loop, DEFAULT_BACKLOG, family, server->alloc_client, server->free_client, config->close_timeout_ns, server_socket_closed);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	if (config->use_tcp_fastopen) {
		return cio_server_socket_set_tcp_fast_open(&server->server_socket, true);
	}

	return CIO_SUCCESS;
}